

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O0

IPCObject * __thiscall
gnilk::IPCBinaryDecoder::ReadObject(IPCBinaryDecoder *this,uint8_t expectedMsgId)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  IPCDeserializer *handler;
  byte local_20;
  IPCMsgHeader header;
  uint8_t expectedMsgId_local;
  IPCBinaryDecoder *this_local;
  
  header.msgHeaderVersion = expectedMsgId;
  unique0x100000e4 = this;
  IPCMsgHeader::IPCMsgHeader((IPCMsgHeader *)((long)&handler + 7));
  iVar1 = (**(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader)
                    (this,(long)&handler + 7,8);
  if (iVar1 < 0) {
    this_local = (IPCBinaryDecoder *)0x0;
  }
  else if (local_20 == header.msgHeaderVersion) {
    iVar1 = (*(this->deserializer->super_IPCObject)._vptr_IPCObject[2])
                      (this->deserializer,(ulong)local_20);
    this_local = (IPCBinaryDecoder *)CONCAT44(extraout_var,iVar1);
    uVar2 = (*(this_local->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[3])
                      (this_local,this);
    if ((uVar2 & 1) == 0) {
      this_local = (IPCBinaryDecoder *)0x0;
    }
  }
  else {
    this_local = (IPCBinaryDecoder *)0x0;
  }
  return (IPCObject *)this_local;
}

Assistant:

IPCObject *IPCBinaryDecoder::ReadObject(uint8_t expectedMsgId) {
    IPCMsgHeader header;
    if (Read(&header, sizeof(header)) < 0) {
        return nullptr;
    }
    if (header.msgId != expectedMsgId) {
        return nullptr;
    }
    auto handler = deserializer.GetDeserializerForObject(header.msgId);
    if (!handler->Unmarshal(*this)) {
        return nullptr;
    }
    return handler;
}